

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupPoint(void *pContext,CUIRect View)

{
  int iVar1;
  int iVar2;
  CQuad *pCVar3;
  long in_RDI;
  long in_FS_OFFSET;
  int v_5;
  int v_4;
  int v_3;
  int v_2;
  int v_1;
  int Prop;
  int v;
  int tv;
  int tu;
  int y;
  int x;
  int Color;
  CQuad *pQuad;
  CEditor *pEditor;
  int NewVal;
  CProperty aProps [6];
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined4 in_stack_ffffffffffffff18;
  int iVar4;
  undefined4 in_stack_ffffffffffffff1c;
  int local_e0;
  int local_d4;
  int local_d0;
  char *pNewVal;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char *pToolBox;
  undefined4 uVar8;
  undefined1 auStack_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = GetSelectedQuad((CEditor *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  local_d0 = 0;
  local_d4 = 0;
  for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
    if ((*(uint *)(in_RDI + 0x10e0) & 1 << ((byte)local_e0 & 0x1f)) != 0) {
      local_d0 = fx2i(pCVar3->m_aPoints[local_e0].x);
      local_d4 = fx2i(pCVar3->m_aPoints[local_e0].y);
      fx2f(pCVar3->m_aTexcoords[local_e0].x);
      fx2f(pCVar3->m_aTexcoords[local_e0].y);
    }
  }
  pNewVal = "Pos X";
  uVar5 = 3;
  uVar6 = 0xfff0bdc0;
  uVar7 = 1000000;
  pToolBox = "Pos Y";
  uVar8 = 3;
  array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::size
            ((array<CEnvelope_*,_allocator_default<CEnvelope_*>_> *)(in_RDI + 0x1270));
  memset(auStack_20,0,0x18);
  iVar1 = DoProperties((CEditor *)CONCAT44(uVar8,local_d4),(CUIRect *)pToolBox,
                       (CProperty *)CONCAT44(uVar7,uVar6),(int *)CONCAT44(uVar5,local_d0),
                       (int *)pNewVal);
  if (iVar1 != -1) {
    *(undefined1 *)(in_RDI + 0x1248) = 1;
  }
  if (iVar1 == 0) {
    for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
      if ((*(uint *)(in_RDI + 0x10e0) & 1 << ((byte)iVar4 & 0x1f)) != 0) {
        iVar2 = i2fx(0);
        pCVar3->m_aPoints[iVar4].x = iVar2;
      }
    }
  }
  if (iVar1 == 1) {
    for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
      if ((*(uint *)(in_RDI + 0x10e0) & 1 << ((byte)local_ec & 0x1f)) != 0) {
        iVar4 = i2fx(0);
        pCVar3->m_aPoints[local_ec].y = iVar4;
      }
    }
  }
  if (iVar1 == 2) {
    for (local_f0 = 0; local_f0 < 4; local_f0 = local_f0 + 1) {
      if ((*(uint *)(in_RDI + 0x10e0) & 1 << ((byte)local_f0 & 0x1f)) != 0) {
        pCVar3->m_aColors[local_f0].r = 0;
        pCVar3->m_aColors[local_f0].g = 0;
        pCVar3->m_aColors[local_f0].b = 0;
        pCVar3->m_aColors[local_f0].a = 0;
      }
    }
  }
  if (iVar1 == 3) {
    for (local_f4 = 0; local_f4 < 4; local_f4 = local_f4 + 1) {
      if ((*(uint *)(in_RDI + 0x10e0) & 1 << ((byte)local_f4 & 0x1f)) != 0) {
        iVar4 = f2fx(0.0);
        pCVar3->m_aTexcoords[local_f4].x = iVar4;
      }
    }
  }
  if (iVar1 == 4) {
    for (local_f8 = 0; local_f8 < 4; local_f8 = local_f8 + 1) {
      if ((*(uint *)(in_RDI + 0x10e0) & 1 << ((byte)local_f8 & 0x1f)) != 0) {
        iVar1 = f2fx(0.0);
        pCVar3->m_aTexcoords[local_f8].y = iVar1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupPoint(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CQuad *pQuad = pEditor->GetSelectedQuad();

	enum
	{
		PROP_POS_X=0,
		PROP_POS_Y,
		PROP_COLOR,
		PROP_TEX_U,
		PROP_TEX_V,
		NUM_PROPS,
	};

	int Color = 0;
	int x = 0, y = 0;
	int tu = 0, tv = 0;

	for(int v = 0; v < 4; v++)
	{
		if(pEditor->m_SelectedPoints&(1<<v))
		{
			Color = 0;
			Color |= pQuad->m_aColors[v].r<<24;
			Color |= pQuad->m_aColors[v].g<<16;
			Color |= pQuad->m_aColors[v].b<<8;
			Color |= pQuad->m_aColors[v].a;

			x = fx2i(pQuad->m_aPoints[v].x);
			y = fx2i(pQuad->m_aPoints[v].y);
			tu = fx2f(pQuad->m_aTexcoords[v].x)*1024;
			tv = fx2f(pQuad->m_aTexcoords[v].y)*1024;
		}
	}


	CProperty aProps[] = {
		{"Pos X", x, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Pos Y", y, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Color", Color, PROPTYPE_COLOR, -1, pEditor->m_Map.m_lEnvelopes.size()},
		{"Tex U", tu, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Tex V", tv, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{0},
	};

	static int s_aIds[NUM_PROPS] = {0};
	int NewVal = 0;
	int Prop = pEditor->DoProperties(&View, aProps, s_aIds, &NewVal);
	if(Prop != -1)
		pEditor->m_Map.m_Modified = true;

	if(Prop == PROP_POS_X)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aPoints[v].x = i2fx(NewVal);
	}
	if(Prop == PROP_POS_Y)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aPoints[v].y = i2fx(NewVal);
	}
	if(Prop == PROP_COLOR)
	{
		for(int v = 0; v < 4; v++)
		{
			if(pEditor->m_SelectedPoints&(1<<v))
			{
				pQuad->m_aColors[v].r = (NewVal>>24)&0xff;
				pQuad->m_aColors[v].g = (NewVal>>16)&0xff;
				pQuad->m_aColors[v].b = (NewVal>>8)&0xff;
				pQuad->m_aColors[v].a = NewVal&0xff;
			}
		}
	}
	if(Prop == PROP_TEX_U)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aTexcoords[v].x = f2fx(NewVal/1024.0f);
	}
	if(Prop == PROP_TEX_V)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aTexcoords[v].y = f2fx(NewVal/1024.0f);
	}

	return false;
}